

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O0

void getcoverages(vector<float,_std::allocator<float>_> *coverages)

{
  int iVar1;
  reference pvVar2;
  size_t local_38;
  size_t i;
  int coverage_id;
  uint nrec;
  OASIS_FLOAT tiv;
  longlong sz;
  FILE *fin;
  vector<float,_std::allocator<float>_> *coverages_local;
  
  fin = (FILE *)coverages;
  sz = (longlong)fopen("input/coverages.bin","rb");
  if ((FILE *)sz == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error reading file %s\n","getcoverages","input/coverages.bin");
    exit(-1);
  }
  fseek((FILE *)sz,0,2);
  _nrec = ftell((FILE *)sz);
  fseek((FILE *)sz,0,0);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)fin,(ulong)((int)(_nrec >> 2) + 1));
  i._4_4_ = 0;
  local_38 = fread(&coverage_id,4,1,(FILE *)sz);
  while (iVar1 = coverage_id, local_38 != 0) {
    i._4_4_ = i._4_4_ + 1;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)fin,(long)i._4_4_);
    *pvVar2 = (value_type)iVar1;
    local_38 = fread(&coverage_id,4,1,(FILE *)sz);
  }
  fclose((FILE *)sz);
  return;
}

Assistant:

void getcoverages(std::vector<OASIS_FLOAT> &coverages)
{
	FILE *fin = fopen(COVERAGES_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error reading file %s\n", __func__, COVERAGES_FILE);
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	unsigned int nrec = static_cast<unsigned int>(sz / sizeof(tiv));

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);

}